

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

void __thiscall pbrt::ImageTileIntegrator::Render(ImageTileIntegrator *this)

{
  optional<float> oVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ushort uVar7;
  int64_t *piVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  memory_resource *pmVar13;
  undefined4 extraout_var;
  Allocator AVar14;
  undefined4 extraout_var_00;
  ulong uVar15;
  aligned_storage_t<sizeof(int),_alignof(int)> *paVar16;
  FILE *pFVar17;
  int iVar18;
  ulong uVar19;
  Tuple2<pbrt::Point2,_int> TVar20;
  int iVar21;
  function<void_(pbrt::Bounds2<int>)> *func;
  size_t sVar22;
  aligned_storage_t<sizeof(int),_alignof(int)> aVar23;
  string *name;
  long lVar24;
  int iVar25;
  char *fmt;
  _Alloc_hider _Var26;
  CameraHandle *pCVar27;
  long in_FS_OFFSET;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  undefined8 in_XMM2_Qb;
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  CheckCallbackScope _;
  int waveStart;
  int waveEnd;
  Bounds2i cropBounds;
  Point2i va;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> samplers;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> scratchBuffers;
  ScratchBuffer scratchBuffer;
  Bounds2i msePixelBounds;
  optional<pbrt::Image> referenceImage;
  ProgressReporter progress;
  CheckCallbackScope local_8e5;
  aligned_storage_t<sizeof(int),_alignof(int)> local_8e4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_8e0;
  int iStack_8dc;
  aligned_storage_t<sizeof(float),_alignof(float)> aStack_8d8;
  int iStack_8d4;
  aligned_storage_t<sizeof(int),_alignof(int)> local_8c4;
  FILE *local_8c0;
  CameraHandle *local_8b8;
  aligned_storage_t<sizeof(float),_alignof(float)> local_8b0;
  undefined4 uStack_8ac;
  undefined8 uStack_8a8;
  ImageChannelValues local_8a0;
  optional<float> local_870;
  undefined8 uStack_868;
  undefined1 local_858 [8];
  undefined1 auStack_850 [8];
  undefined1 local_848 [144];
  bool local_7b8;
  bool local_7ac;
  aligned_storage_t<sizeof(int),_alignof(int)> local_7a8;
  uint uStack_7a4;
  aligned_storage_t<sizeof(float),_alignof(float)> local_7a0;
  uint uStack_79c;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_798;
  bool local_790;
  undefined7 uStack_78f;
  undefined1 local_788 [48];
  float *local_758;
  size_t local_750;
  size_t local_748;
  Bounds2i local_740;
  code *pcStack_730;
  code *pcStack_728;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_718;
  _Base_ptr local_710;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_708;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_700;
  _Base_ptr local_6f8;
  ImageTileIntegrator *local_6f0;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_6e8;
  ImageChannelDesc local_6d0;
  vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> local_6a0;
  undefined1 local_680 [8];
  uint local_678;
  int iStack_674;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_670;
  undefined1 local_660 [32];
  long local_640 [2];
  long local_630 [13];
  polymorphic_allocator<unsigned_char> local_5c8;
  uchar *local_5c0;
  size_t local_5b8;
  size_t local_5b0;
  polymorphic_allocator<pbrt::Half> local_5a8;
  Half *local_5a0;
  size_t local_598;
  size_t local_590;
  polymorphic_allocator<float> local_588;
  float *local_580;
  size_t local_578;
  size_t local_570;
  bool local_564;
  bool local_520;
  bool local_4dc;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_4d8;
  bool local_4c8;
  bool local_4bc;
  bool local_4b4;
  bool local_4ac;
  bool local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_498;
  _Any_data local_460;
  code *pcStack_450;
  code *pcStack_448;
  ImageMetadata local_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  _Any_data local_320;
  code *local_310;
  code *local_308;
  ColorEncodingHandle local_2f8;
  optional<float> local_2f0;
  undefined1 local_2e8 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_230;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_210;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> vStack_1f0;
  bool local_1d0;
  ProgressReporter local_1c8;
  ImageMetadata local_178;
  
  if (*(size_t *)(Options + 0x90) != 0) {
    str._M_str = *(char **)(Options + 0x88);
    str._M_len = *(size_t *)(Options + 0x90);
    SplitStringToInts((optional<std::vector<int,_std::allocator<int>_>_> *)local_2e8,str,',');
    if ((bool)local_2d8.ptr._0_1_ == false) {
      fmt = "Didn\'t find integer values after --debugstart: %s";
    }
    else {
      piVar8 = (int64_t *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
      if (CONCAT44(local_2e8._12_4_,local_2e8._8_4_) - (long)piVar8 == 0xc) {
        local_1c8.totalWork = *piVar8;
        uVar12 = *(uint *)(piVar8 + 1);
        local_680 = (undefined1  [8])0x0;
        local_678 = local_678 & 0xffffff00;
        iStack_674 = 0x10000;
        aStack_670._M_allocated_capacity._0_4_ = 0;
        pmVar13 = pstd::pmr::new_delete_resource();
        iVar10 = (*pmVar13->_vptr_memory_resource[2])(pmVar13,0x10000,0x40);
        local_680 = (undefined1  [8])CONCAT44(extraout_var,iVar10);
        local_678 = CONCAT31(local_678._1_3_,true);
        AVar14.memoryResource = pstd::pmr::new_delete_resource();
        SamplerHandle::Clone
                  ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)local_858,
                   &this->samplerPrototype,1,AVar14);
        oVar1 = *(optional<float> *)local_858;
        operator_delete((void *)local_858,local_848._0_8_ - (long)local_858);
        auStack_850 = (undefined1  [8])&local_8a0;
        local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource._0_4_ = uVar12;
        local_848._0_8_ = &local_6d0;
        local_6d0.offset.alloc.memoryResource =
             (memory_resource *)((ulong)local_6d0.offset.alloc.memoryResource._4_4_ << 0x20);
        local_858 = (undefined1  [8])&local_1c8;
        local_440.renderTimeSeconds = oVar1;
        detail::DispatchSplit<8>::operator()
                  ((DispatchSplit<8> *)&local_6a0,&local_440,(ulong)oVar1 >> 0x30);
        local_2f0 = oVar1;
        (*(this->super_Integrator)._vptr_Integrator[4])
                  (this,&local_1c8,(ulong)uVar12,&local_2f0,local_680);
        ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_680);
        if ((bool)local_2d8.ptr._0_1_ != true) {
          return;
        }
        pvVar9 = (void *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_);
        if (pvVar9 == (void *)0x0) {
          return;
        }
        operator_delete(pvVar9,(long)local_2d8.alloc.memoryResource - (long)pvVar9);
        return;
      }
      fmt = "Didn\'t find three integer values after --debugstart: %s";
    }
    ErrorExit<std::__cxx11::string&>
              (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (Options + 0x88));
  }
  if (*(char *)(in_FS_OFFSET + -0x390) == '\0') {
    *(undefined8 *)(in_FS_OFFSET + -0x398) = 0;
    *(undefined1 *)(in_FS_OFFSET + -0x390) = 1;
  }
  local_320._M_unused._M_object = (void *)0x0;
  local_320._8_8_ = 0;
  local_308 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:138:26)>
              ::_M_manager;
  CheckCallbackScope::CheckCallbackScope
            (&local_8e5,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)&local_320);
  if (local_310 != (code *)0x0) {
    (*local_310)(&local_320,&local_320,__destroy_functor);
  }
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.super__Vector_base<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar10 = 0;
  while( true ) {
    iVar11 = MaxThreadIndex();
    if (iVar11 <= iVar10) break;
    local_680 = (undefined1  [8])0x0;
    local_678 = local_678 & 0xffffff00;
    iStack_674 = 0x10000;
    aStack_670._M_allocated_capacity._0_4_ = 0;
    pmVar13 = pstd::pmr::new_delete_resource();
    iVar11 = (*pmVar13->_vptr_memory_resource[2])(pmVar13,0x10000,0x40);
    local_680 = (undefined1  [8])CONCAT44(extraout_var_00,iVar11);
    local_678 = CONCAT31(local_678._1_3_,1);
    std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::
    emplace_back<pbrt::ScratchBuffer>(&local_6a0,(ScratchBuffer *)local_680);
    ScratchBuffer::~ScratchBuffer((ScratchBuffer *)local_680);
    iVar10 = iVar10 + 1;
  }
  iVar10 = MaxThreadIndex();
  AVar14.memoryResource = pstd::pmr::new_delete_resource();
  SamplerHandle::Clone(&local_6e8,&this->samplerPrototype,iVar10,AVar14);
  uVar15 = *(ulong *)(((this->camera).
                       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                       .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff;
  _local_8e0 = *(optional<float> *)(uVar15 + 8);
  _aStack_8d8 = *(optional<float> *)(uVar15 + 0x10);
  uVar15 = (this->samplerPrototype).
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           .bits;
  uVar19 = uVar15 >> 0x30;
  paVar16 = (aligned_storage_t<sizeof(int),_alignof(int)> *)(uVar15 & 0xffffffffffff);
  uVar7 = (ushort)(uVar15 >> 0x30);
  if (uVar19 < 5) {
    uVar12 = (uint)(uVar19 != 2) << 3;
    if (2 < uVar7) {
      uVar12 = (uint)(uVar19 == 3) << 4;
    }
    aVar23 = *(aligned_storage_t<sizeof(int),_alignof(int)> *)((long)paVar16 + (ulong)uVar12);
  }
  else if (uVar7 < 7) {
    aVar23 = *(aligned_storage_t<sizeof(int),_alignof(int)> *)paVar16->__data;
    if (uVar7 == 6) {
      aVar23.__data = aVar23.__data * paVar16[1];
    }
  }
  else {
    aVar23 = *paVar16;
  }
  local_8b0 = aStack_8d8;
  uStack_8ac = aStack_8d8;
  uStack_8a8 = 0;
  uStack_868 = 0;
  local_680 = (undefined1  [8])&aStack_670;
  local_870 = _local_8e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"Rendering","");
  auVar2._4_4_ = uStack_8ac;
  auVar2._0_4_ = local_8b0;
  auVar2._8_8_ = uStack_8a8;
  auVar3._8_8_ = uStack_868;
  auVar3._0_4_ = local_870.optionalValue;
  auVar3[4] = local_870.set;
  auVar3._5_3_ = local_870._5_3_;
  auVar3 = vpsubd_avx(auVar2,auVar3);
  auVar2 = vpshufd_avx(auVar3,0x55);
  auVar2 = vpmulld_avx(auVar2,auVar3);
  ProgressReporter::ProgressReporter
            (&local_1c8,(long)auVar2._0_4_ * (long)(int)aVar23,(string *)local_680,
             *(bool *)(Options + 9),false);
  local_8b0 = aVar23;
  if (local_680 != (undefined1  [8])&aStack_670) {
    operator_delete((void *)local_680,
                    CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                             aStack_670._M_allocated_capacity._0_4_) + 1);
  }
  pCVar27 = &this->camera;
  local_8e4 = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_8c4 = (aligned_storage_t<sizeof(int),_alignof(int)>)0x1;
  if (*(char *)(Options + 10) == '\x01') {
    local_858 = *(undefined1 (*) [8])
                 (((pCVar27->
                   super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                   ).bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)local_2e8,(FilmHandle *)local_858);
    RemoveExtension((string *)local_680,(string *)local_2e8);
    StatsEnablePixelStats((Bounds2i *)&local_8e0.__align,(string *)local_680);
    if (local_680 != (undefined1  [8])&aStack_670) {
      operator_delete((void *)local_680,
                      CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                               aStack_670._M_allocated_capacity._0_4_) + 1);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_) != &local_2d8) {
      operator_delete((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(local_2e8._4_4_,local_2e8._0_4_),
                      (long)local_2d8.alloc.memoryResource + 1);
    }
  }
  local_1d0 = false;
  local_8b8 = pCVar27;
  if (*(long *)(Options + 0x50) != 0) {
    name = (string *)(Options + 0x48);
    AVar14.memoryResource = pstd::pmr::new_delete_resource();
    local_2f8.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read((ImageAndMetadata *)local_680,name,AVar14,&local_2f8);
    pstd::optional<pbrt::Image>::reset((optional<pbrt::Image> *)local_2e8);
    Image::Image((Image *)local_2e8,(Image *)local_680);
    local_1d0 = true;
    if (local_4c8 == true) {
      local_440.renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)local_4d8.__align;
      local_440.renderTimeSeconds.set = (bool)local_4d8.__data[4];
      local_440.renderTimeSeconds._5_3_ = local_4d8._5_3_;
      local_440.cameraFromWorld.optionalValue._0_8_ = local_4d8._8_8_;
    }
    else {
      local_440.renderTimeSeconds.optionalValue =
           (aligned_storage_t<sizeof(float),_alignof(float)>)
           ((int)local_2e8._4_4_ >> 0x1f & local_2e8._4_4_);
      local_440.renderTimeSeconds._4_4_ = (int)local_2e8._8_4_ >> 0x1f & local_2e8._8_4_;
      uVar19 = 0;
      uVar15 = 0;
      if (0 < (int)local_2e8._4_4_) {
        uVar15 = (ulong)(uint)local_2e8._4_4_;
      }
      if (0 < (int)local_2e8._8_4_) {
        uVar19 = (ulong)(uint)local_2e8._8_4_;
      }
      local_440.cameraFromWorld.optionalValue._0_8_ = uVar15 | uVar19 << 0x20;
    }
    iVar10 = (int)local_8e0 - (int)local_440.renderTimeSeconds.optionalValue;
    if ((int)local_440.renderTimeSeconds.optionalValue <= (int)local_8e0) {
      if ((int)aStack_8d8 <= (int)local_440.cameraFromWorld.optionalValue.__align) {
        if ((int)local_440.renderTimeSeconds._4_4_ <= iStack_8dc) {
          if (iStack_8d4 <= (int)local_440.cameraFromWorld.optionalValue._4_4_) {
            iVar25 = iStack_8dc - local_440.renderTimeSeconds._4_4_;
            iVar18 = (int)aStack_8d8 - (int)local_440.renderTimeSeconds.optionalValue;
            iVar21 = iStack_8d4 - local_440.renderTimeSeconds._4_4_;
            iVar11 = iVar10;
            if (iVar18 < iVar10) {
              iVar11 = iVar18;
            }
            iVar6 = iVar25;
            if (iVar21 < iVar25) {
              iVar6 = iVar21;
            }
            local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
            memoryResource = (memory_resource *)CONCAT44(iVar6,iVar11);
            if (iVar18 < iVar10) {
              iVar18 = iVar10;
            }
            if (iVar21 < iVar25) {
              iVar21 = iVar25;
            }
            local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr.
            _4_4_ = iVar21;
            local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr.
            _0_4_ = iVar18;
            AVar14.memoryResource = pstd::pmr::new_delete_resource();
            Image::Crop((Image *)local_858,(Image *)local_2e8,(Bounds2i *)&local_8a0,AVar14);
            if (local_1d0 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
            }
            local_2e8._8_4_ = auStack_850._0_4_;
            local_2e8._0_4_ = local_858._0_4_;
            local_2e8._4_4_ = local_858._4_4_;
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&local_2d8,
                        (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_848);
            pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                      (&local_230,
                       (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                       &local_7a0.__align);
            pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                      (&local_210,
                       (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                       (local_788 + 8));
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                      (&vStack_1f0,
                       (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(local_788 + 0x28)
                      );
            local_748 = 0;
            (*(*(_func_int ***)local_788._40_8_)[3])(local_788._40_8_,local_758,local_750 << 2,4);
            local_788._32_8_ = (_Base_ptr)0x0;
            (**(code **)(*(long *)CONCAT44(local_788._12_4_,local_788._8_4_) + 0x18))
                      ((long *)CONCAT44(local_788._12_4_,local_788._8_4_),local_788._16_8_,
                       local_788._24_8_ * 2,2);
            local_788._0_8_ = 0;
            (**(code **)(*(long *)CONCAT44(uStack_79c,local_7a0) + 0x18))
                      ((long *)CONCAT44(uStack_79c,local_7a0),local_798,
                       CONCAT71(uStack_78f,local_790),1);
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_848);
            if (local_1d0 == false) {
              LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
            }
            local_858._4_4_ = local_2e8._8_4_;
            local_858._0_4_ = local_2e8._4_4_;
            auVar30._8_8_ = 0;
            auVar30._0_4_ = aStack_8d8;
            auVar30[4] = iStack_8d4._0_1_;
            auVar30._5_3_ = iStack_8d4._1_3_;
            auVar32._8_8_ = 0;
            auVar32._0_4_ = local_8e0;
            auVar32[4] = iStack_8dc._0_1_;
            auVar32._5_3_ = iStack_8dc._1_3_;
            auVar2 = vpsubd_avx(auVar30,auVar32);
            local_6d0.offset.alloc.memoryResource = auVar2._0_8_;
            auVar33._8_8_ = 0;
            auVar33._0_4_ = local_2e8._4_4_;
            auVar33[4] = SUB41(local_2e8._8_4_,0);
            auVar33._5_3_ = SUB43(local_2e8._8_4_,1);
            uVar15 = vpcmpd_avx512vl(auVar2,auVar33,4);
            if ((uVar15 & 3) != 0) {
              LogFatal<char_const(&)[29],char_const(&)[32],char_const(&)[29],pbrt::Point2<int>&,char_const(&)[32],pbrt::Point2<int>&>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                         ,0xba,"Check failed: %s == %s with %s = %s, %s = %s",
                         (char (*) [29])"referenceImage->Resolution()",
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",
                         (char (*) [29])"referenceImage->Resolution()",(Point2<int> *)local_858,
                         (char (*) [32])"Point2i(pixelBounds.Diagonal())",(Point2<int> *)&local_6d0)
              ;
            }
            pFVar17 = fopen(*(char **)(Options + 0x68),"w");
            lVar24 = Options;
            if (pFVar17 == (FILE *)0x0) {
              LastError();
              ErrorString_abi_cxx11_(0);
              ErrorExit<std::__cxx11::string&,std::__cxx11::string>
                        ("%s: %s",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar24 + 0x68),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_858);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_498);
            pCVar27 = local_8b8;
            if (local_4a0 == true) {
              local_4a0 = false;
            }
            if (local_4ac == true) {
              local_4ac = false;
            }
            if (local_4b4 == true) {
              local_4b4 = false;
            }
            if (local_4bc == true) {
              local_4bc = false;
            }
            if (local_4c8 == true) {
              local_4c8 = false;
            }
            if (local_4dc == true) {
              local_4dc = false;
            }
            if (local_520 == true) {
              local_520 = false;
            }
            if (local_564 == true) {
              local_564 = false;
            }
            local_570 = 0;
            (*(local_588.memoryResource)->_vptr_memory_resource[3])
                      (local_588.memoryResource,local_580,local_578 << 2,4);
            local_590 = 0;
            (*(local_5a8.memoryResource)->_vptr_memory_resource[3])
                      (local_5a8.memoryResource,local_5a0,local_598 * 2,2);
            local_5b0 = 0;
            (*(local_5c8.memoryResource)->_vptr_memory_resource[3])
                      (local_5c8.memoryResource,local_5c0,local_5b8,1);
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&aStack_670);
            goto LAB_004051b8;
          }
        }
      }
    }
    ErrorExit<pbrt::Bounds2<int>&,pbrt::Bounds2<int>&>
              ("Output image pixel bounds %s aren\'t inside the MSE image\'s pixel bounds %s.",
               (Bounds2<int> *)&local_8e0.__align,(Bounds2<int> *)&local_440);
  }
  pFVar17 = (FILE *)0x0;
LAB_004051b8:
  local_8c0 = pFVar17;
  if (*(long *)(Options + 0xb0) != 0) {
    local_440.renderTimeSeconds =
         *(optional<float> *)
          (((pCVar27->
            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
            ).bits & 0xffffffffffff) + 0x340);
    FilmHandle::GetFilename_abi_cxx11_((string *)local_858,(FilmHandle *)&local_440);
    auVar31._8_8_ = 0;
    auVar31._0_4_ = aStack_8d8;
    auVar31[4] = iStack_8d4._0_1_;
    auVar31._5_3_ = iStack_8d4._1_3_;
    auVar34._8_8_ = 0;
    auVar34._0_4_ = local_8e0;
    auVar34[4] = iStack_8dc._0_1_;
    auVar34._5_3_ = iStack_8dc._1_3_;
    auVar2 = vpsubd_avx(auVar31,auVar34);
    local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
    memoryResource = auVar2._0_8_;
    local_680 = (undefined1  [8])&aStack_670;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_680,"R","");
    local_660._0_8_ = local_660 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_660,"G","");
    _Var26._M_p = (pointer)local_630;
    local_640[0] = (long)_Var26._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_640,"B","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_680;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_338,__l,(allocator_type *)&local_6d0);
    oVar1 = local_440.renderTimeSeconds;
    local_460._M_unused._M_object = (void *)0x0;
    local_460._8_8_ = 0;
    pcStack_450 = (code *)0x0;
    pcStack_448 = (code *)0x0;
    local_460._M_unused._M_object = operator_new(0x18);
    *(optional<float> *)local_460._M_unused._0_8_ = oVar1;
    *(optional<float> *)((long)local_460._M_unused._0_8_ + 8) = _local_8e0;
    *(optional<float> *)((long)local_460._M_unused._0_8_ + 0x10) = _aStack_8d8;
    pcStack_448 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_invoke;
    pcStack_450 = std::
                  _Function_handler<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:198:24)>
                  ::_M_manager;
    DisplayDynamic((string *)local_858,(Point2i *)&local_8a0,&local_338,
                   (function<void_(pbrt::Bounds2<int>,_pstd::span<pstd::span<float>_>)> *)&local_460
                  );
    if (pcStack_450 != (code *)0x0) {
      (*pcStack_450)(&local_460,&local_460,__destroy_functor);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_338);
    lVar24 = -0x60;
    do {
      if ((long *)_Var26._M_p != *(long **)((long)_Var26._M_p + -0x10)) {
        operator_delete(*(long **)((long)_Var26._M_p + -0x10),*(long *)_Var26._M_p + 1);
      }
      _Var26._M_p = _Var26._M_p + -0x20;
      lVar24 = lVar24 + 0x20;
    } while (lVar24 != 0);
    if (local_858 != (undefined1  [8])local_848) {
      operator_delete((void *)local_858,(ulong)(local_848._0_8_ + 1));
    }
  }
  local_6f0 = this;
  if ((int)local_8e4 < (int)local_8b0) {
    local_6f8 = (_Base_ptr)(local_788 + 8);
    local_710 = &local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
    local_718 = &local_440.stringVectors;
    local_708 = &local_178.stringVectors;
    local_700 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)local_788;
    local_870.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x1;
    local_870.set = false;
    local_870._5_3_ = 0;
    do {
      local_740.pMin.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_740.pMin.super_Tuple2<pbrt::Point2,_int>.y = 0;
      local_740.pMax.super_Tuple2<pbrt::Point2,_int>.x = 0;
      local_740.pMax.super_Tuple2<pbrt::Point2,_int>.y = 0;
      pcStack_730 = (code *)0x0;
      pcStack_728 = (code *)0x0;
      local_740.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)operator_new(0x30)
      ;
      *(vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_> **)
       local_740.pMin.super_Tuple2<pbrt::Point2,_int> = &local_6a0;
      *(vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> **)
       ((long)local_740.pMin.super_Tuple2<pbrt::Point2,_int> + 8) = &local_6e8;
      *(aligned_storage_t<sizeof(int),_alignof(int)> **)
       ((long)local_740.pMin.super_Tuple2<pbrt::Point2,_int> + 0x10) = &local_8e4;
      *(aligned_storage_t<sizeof(int),_alignof(int)> **)
       ((long)local_740.pMin.super_Tuple2<pbrt::Point2,_int> + 0x18) = &local_8c4;
      *(ImageTileIntegrator **)((long)local_740.pMin.super_Tuple2<pbrt::Point2,_int> + 0x20) =
           local_6f0;
      *(ProgressReporter **)((long)local_740.pMin.super_Tuple2<pbrt::Point2,_int> + 0x28) =
           &local_1c8;
      pcStack_728 = std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                    ::_M_invoke;
      pcStack_730 = std::
                    _Function_handler<void_(pbrt::Bounds2<int>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp:212:36)>
                    ::_M_manager;
      ParallelFor2D((pbrt *)&local_8e0.__align,&local_740,func);
      if (pcStack_730 != (code *)0x0) {
        (*pcStack_730)(&local_740,&local_740,3);
      }
      local_8e4 = local_8c4;
      local_8c4.__data = local_8c4.__data + local_870.optionalValue;
      if ((int)local_8b0 <= (int)local_8c4) {
        local_8c4 = local_8b0;
      }
      uVar12 = (int)local_870.optionalValue * 2;
      if (0x3f < (int)uVar12) {
        uVar12 = 0x40;
      }
      local_870 = (optional<float>)((ulong)local_870 & 0xffffffff);
      if (local_1d0 == false) {
        local_870._4_4_ = 0;
        local_870.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)uVar12;
      }
      if (LOGGING_LogLevel < 1) {
        local_680 = (undefined1  [8])&aStack_670;
        local_678 = 0;
        iStack_674 = 0;
        aStack_670._M_allocated_capacity._0_4_ = aStack_670._M_allocated_capacity._0_4_ & 0xffffff00
        ;
        detail::stringPrintfRecursive<int&>
                  ((string *)local_680,"Writing image with spp = %d",(int *)local_8e4.__data);
        Log(Verbose,
            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
            ,0xf4,(char *)local_680);
        if (local_680 != (undefined1  [8])&aStack_670) {
          operator_delete((void *)local_680,
                          CONCAT44(aStack_670._M_allocated_capacity._4_4_,
                                   aStack_670._M_allocated_capacity._0_4_) + 1);
        }
      }
      local_858[4] = 0;
      local_848[0x38] = '\0';
      local_848[0x7c] = '\0';
      local_7b8 = false;
      local_7ac = false;
      uStack_7a4 = uStack_7a4 & 0xffffff00;
      uStack_79c = uStack_79c & 0xffffff00;
      local_790 = false;
      local_788._8_4_ = _S_red;
      local_788._16_8_ = (_Base_ptr)0x0;
      local_788._24_8_ = local_6f8;
      local_788._32_8_ = local_6f8;
      local_788._40_8_ = (memory_resource *)0x0;
      lVar24 = std::chrono::_V2::steady_clock::now();
      if ((bool)local_858[4] == true) {
        local_858 = (undefined1  [8])((ulong)local_858 & 0xffffff0000000000);
      }
      local_858[4] = 1;
      local_858._0_4_ =
           (float)((double)((lVar24 - (long)local_1c8.timer.start.__d.__r) / 1000) / 1000000.0);
      if (uStack_7a4._0_1_ == true) {
        uStack_7a4 = uStack_7a4 & 0xffffff00;
      }
      local_7a8 = local_8e4;
      uStack_7a4 = CONCAT31(uStack_7a4._1_3_,1);
      if (local_1d0 == true) {
        local_440.renderTimeSeconds.set = false;
        local_440.cameraFromWorld.set = false;
        local_440.NDCFromWorld.set = false;
        local_440.pixelBounds.set = false;
        local_440.fullResolution.set = false;
        local_440.samplesPerPixel.set = false;
        local_440.MSE.set = false;
        local_440.colorSpace.set = false;
        local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_710;
        local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_710;
        local_440.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource =
             *(memory_resource **)
              (((local_8b8->
                super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                ).bits & 0xffffffffffff) + 0x340);
        FilmHandle::GetImage
                  ((Image *)local_680,(FilmHandle *)&local_8a0,&local_440,
                   1.0 / (float)(int)local_8e4);
        Image::AllChannelsDesc(&local_6d0,(Image *)local_680);
        if (local_1d0 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
        }
        Image::MSE(&local_8a0,(Image *)local_680,&local_6d0,(Image *)local_2e8,(Image *)0x0);
        local_6d0.offset.nStored = 0;
        (*(local_6d0.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_6d0.offset.alloc.memoryResource,local_6d0.offset.ptr,
                   local_6d0.offset.nAlloc << 2,4);
        fVar28 = 0.0;
        fVar29 = 0.0;
        if (local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
            nStored != 0) {
          TVar20 = (Tuple2<pbrt::Point2,_int>)
                   local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr;
          if ((Tuple2<pbrt::Point2,_int>)
              local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
              == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar20 = (Tuple2<pbrt::Point2,_int>)
                     &local_8a0.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          sVar22 = 0;
          do {
            fVar28 = fVar28 + *(float *)((long)TVar20 + sVar22 * 4);
            sVar22 = sVar22 + 1;
            fVar29 = fVar28;
          } while (local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .nStored != sVar22);
        }
        auVar4._4_4_ = in_XMM2_Db;
        auVar4._0_4_ = in_XMM2_Da;
        auVar4._8_8_ = in_XMM2_Qb;
        auVar2 = vcvtusi2ss_avx512f(auVar4,local_8a0.
                                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           .nStored);
        fprintf(local_8c0,"%d, %.9g\n",(double)(fVar29 / auVar2._0_4_),(ulong)(uint)local_8e4);
        fVar28 = 0.0;
        fVar29 = 0.0;
        if (local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
            nStored != 0) {
          TVar20 = (Tuple2<pbrt::Point2,_int>)
                   local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr;
          if ((Tuple2<pbrt::Point2,_int>)
              local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
              == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar20 = (Tuple2<pbrt::Point2,_int>)
                     &local_8a0.
                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      field_2;
          }
          sVar22 = 0;
          do {
            fVar28 = fVar28 + *(float *)((long)TVar20 + sVar22 * 4);
            sVar22 = sVar22 + 1;
            fVar29 = fVar28;
          } while (local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .nStored != sVar22);
        }
        if (uStack_79c._0_1_ == true) {
          uStack_79c = uStack_79c & 0xffffff00;
        }
        auVar5._4_4_ = in_XMM2_Db;
        auVar5._0_4_ = in_XMM2_Da;
        auVar5._8_8_ = in_XMM2_Qb;
        auVar2 = vcvtusi2ss_avx512f(auVar5,local_8a0.
                                           super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                           .nStored);
        local_7a0 = (aligned_storage_t<sizeof(float),_alignof(float)>)(fVar29 / auVar2._0_4_);
        uStack_79c = CONCAT31(uStack_79c._1_3_,1);
        fflush(local_8c0);
        local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored =
             0;
        (*(local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
          memoryResource)->_vptr_memory_resource[3])
                  (local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .alloc.memoryResource,
                   local_8a0.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                   .ptr,local_8a0.
                        super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                        nAlloc << 2,4);
        local_570 = 0;
        (*(local_588.memoryResource)->_vptr_memory_resource[3])
                  (local_588.memoryResource,local_580,local_578 << 2,4);
        local_590 = 0;
        (*(local_5a8.memoryResource)->_vptr_memory_resource[3])
                  (local_5a8.memoryResource,local_5a0,local_598 * 2,2);
        local_5b0 = 0;
        (*(local_5c8.memoryResource)->_vptr_memory_resource[3])
                  (local_5c8.memoryResource,local_5c0,local_5b8,1);
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&aStack_670);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_718->_M_t);
        if (local_440.colorSpace.set == true) {
          local_440.colorSpace.set = false;
        }
        if (local_440.MSE.set == true) {
          local_440.MSE.set = false;
        }
        if (local_440.samplesPerPixel.set == true) {
          local_440.samplesPerPixel.set = false;
        }
        if (local_440.fullResolution.set == true) {
          local_440.fullResolution.set = false;
        }
        if (local_440.pixelBounds.set == true) {
          local_440.pixelBounds.set = false;
        }
        if (local_440.NDCFromWorld.set == true) {
          local_440.NDCFromWorld.set = false;
        }
        if (local_440.cameraFromWorld.set == true) {
          local_440.cameraFromWorld.set = false;
        }
        if (local_440.renderTimeSeconds.set == true) {
          local_440.renderTimeSeconds.set = false;
        }
      }
      pCVar27 = local_8b8;
      CameraHandle::InitMetadata(local_8b8,(ImageMetadata *)local_858);
      local_680 = *(undefined1 (*) [8])
                   (((pCVar27->
                     super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                     ).bits & 0xffffffffffff) + 0x340);
      ImageMetadata::ImageMetadata(&local_178,(ImageMetadata *)local_858);
      FilmHandle::WriteImage((FilmHandle *)local_680,&local_178,1.0 / (float)(int)local_8e4);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_708->_M_t);
      if (local_178.colorSpace.set == true) {
        local_178.colorSpace.set = false;
      }
      if (local_178.MSE.set == true) {
        local_178.MSE.set = false;
      }
      if (local_178.samplesPerPixel.set == true) {
        local_178.samplesPerPixel.set = false;
      }
      if (local_178.fullResolution.set == true) {
        local_178.fullResolution.set = false;
      }
      if (local_178.pixelBounds.set == true) {
        local_178.pixelBounds.set = false;
      }
      if (local_178.NDCFromWorld.set == true) {
        local_178.NDCFromWorld.set = false;
      }
      if (local_178.cameraFromWorld.set == true) {
        local_178.cameraFromWorld.set = false;
      }
      if (local_178.renderTimeSeconds.set == true) {
        local_178.renderTimeSeconds.set = false;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(local_700);
      if (local_790 == true) {
        local_790 = false;
      }
      if (uStack_79c._0_1_ == true) {
        uStack_79c = uStack_79c & 0xffffff00;
      }
      if (uStack_7a4._0_1_ == true) {
        uStack_7a4 = uStack_7a4 & 0xffffff00;
      }
      if (local_7ac == true) {
        local_7ac = false;
      }
      if (local_7b8 == true) {
        local_7b8 = false;
      }
      if (local_848[0x7c] == '\x01') {
        local_848[0x7c] = '\0';
      }
      if (local_848[0x38] == '\x01') {
        local_848[0x38] = '\0';
      }
      if ((bool)local_858[4] == true) {
        local_858[4] = 0;
      }
    } while ((int)local_8e4 < (int)local_8b0);
  }
  if (local_8c0 != (FILE *)0x0) {
    fclose(local_8c0);
  }
  ProgressReporter::Done(&local_1c8);
  if (LOGGING_LogLevel < 1) {
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
        ,0x108,"Rendering finished");
  }
  pstd::optional<pbrt::Image>::reset((optional<pbrt::Image> *)local_2e8);
  ProgressReporter::~ProgressReporter(&local_1c8);
  if (local_6e8.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6e8.
                    super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_6e8.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6e8.
                          super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<pbrt::ScratchBuffer,_std::allocator<pbrt::ScratchBuffer>_>::~vector(&local_6a0);
  CheckCallbackScope::~CheckCallbackScope(&local_8e5);
  return;
}

Assistant:

void ImageTileIntegrator::Render() {
    // Handle debugStart, if set
    if (!Options->debugStart.empty()) {
        pstd::optional<std::vector<int>> c = SplitStringToInts(Options->debugStart, ',');
        if (!c)
            ErrorExit("Didn't find integer values after --debugstart: %s",
                      Options->debugStart);
        if (c->size() != 3)
            ErrorExit("Didn't find three integer values after --debugstart: %s",
                      Options->debugStart);

        Point2i pPixel((*c)[0], (*c)[1]);
        int sampleIndex = (*c)[2];

        ScratchBuffer scratchBuffer(65536);
        SamplerHandle tileSampler = samplerPrototype.Clone(1, Allocator())[0];
        tileSampler.StartPixelSample(pPixel, sampleIndex);

        EvaluatePixelSample(pPixel, sampleIndex, tileSampler, scratchBuffer);

        return;
    }

    thread_local Point2i threadPixel;
    thread_local int threadSampleIndex;
    CheckCallbackScope _([&]() {
        return StringPrintf("Rendering failed at pixel (%d, %d) sample %d. Debug with "
                            "\"--debugstart %d,%d,%d\"\n",
                            threadPixel.x, threadPixel.y, threadSampleIndex,
                            threadPixel.x, threadPixel.y, threadSampleIndex);
    });

    // Declare common variables for rendering image in tiles
    std::vector<ScratchBuffer> scratchBuffers;
    for (int i = 0; i < MaxThreadIndex(); ++i)
        scratchBuffers.push_back(ScratchBuffer(65536));

    std::vector<SamplerHandle> samplers = samplerPrototype.Clone(MaxThreadIndex());

    Bounds2i pixelBounds = camera.GetFilm().PixelBounds();
    int spp = samplerPrototype.SamplesPerPixel();
    ProgressReporter progress(int64_t(spp) * pixelBounds.Area(), "Rendering",
                              Options->quiet);

    int waveStart = 0, waveEnd = 1, nextWaveSize = 1;

    if (Options->recordPixelStatistics)
        StatsEnablePixelStats(pixelBounds,
                              RemoveExtension(camera.GetFilm().GetFilename()));
    // Handle MSE referene image, if provided
    pstd::optional<Image> referenceImage;
    FILE *mseOutFile = nullptr;
    if (!Options->mseReferenceImage.empty()) {
        auto mse = Image::Read(Options->mseReferenceImage);
        referenceImage = mse.image;

        Bounds2i msePixelBounds =
            mse.metadata.pixelBounds
                ? *mse.metadata.pixelBounds
                : Bounds2i(Point2i(0, 0), referenceImage->Resolution());
        if (!Inside(pixelBounds, msePixelBounds))
            ErrorExit("Output image pixel bounds %s aren't inside the MSE "
                      "image's pixel bounds %s.",
                      pixelBounds, msePixelBounds);

        // Transform the pixelBounds of the image we're rendering to the
        // coordinate system with msePixelBounds.pMin at the origin, which
        // in turn gives us the section of the MSE image to crop. (This is
        // complicated by the fact that Image doesn't support pixel
        // bounds...)
        Bounds2i cropBounds(Point2i(pixelBounds.pMin - msePixelBounds.pMin),
                            Point2i(pixelBounds.pMax - msePixelBounds.pMin));
        *referenceImage = referenceImage->Crop(cropBounds);
        CHECK_EQ(referenceImage->Resolution(), Point2i(pixelBounds.Diagonal()));

        mseOutFile = fopen(Options->mseReferenceOutput.c_str(), "w");
        if (!mseOutFile)
            ErrorExit("%s: %s", Options->mseReferenceOutput, ErrorString());
    }

    // Connect to display server if needed
    if (!Options->displayServer.empty()) {
        FilmHandle film = camera.GetFilm();
        DisplayDynamic(film.GetFilename(), Point2i(pixelBounds.Diagonal()),
                       {"R", "G", "B"},
                       [=](Bounds2i b, pstd::span<pstd::span<Float>> displayValue) {
                           int index = 0;
                           for (Point2i p : b) {
                               RGB rgb = film.GetPixelRGB(pixelBounds.pMin + p);
                               for (int c = 0; c < 3; ++c)
                                   displayValue[c][index] = rgb[c];
                               ++index;
                           }
                       });
    }

    // Render image in waves
    while (waveStart < spp) {
        // Render current wave's image tiles in parallel
        ParallelFor2D(pixelBounds, [&](Bounds2i tileBounds) {
            // Render image tile given by _tileBounds_
            ScratchBuffer &scratchBuffer = scratchBuffers[ThreadIndex];
            SamplerHandle &sampler = samplers[ThreadIndex];
            PBRT_DBG("Starting image tile (%d,%d)-(%d,%d) waveStart %d, waveEnd %d\n",
                     tileBounds.pMin.x, tileBounds.pMin.y, tileBounds.pMax.x,
                     tileBounds.pMax.y, waveStart, waveEnd);
            for (Point2i pPixel : tileBounds) {
                StatsReportPixelStart(pPixel);
                threadPixel = pPixel;
                // Render samples in pixel _pPixel_
                for (int sampleIndex = waveStart; sampleIndex < waveEnd; ++sampleIndex) {
                    threadSampleIndex = sampleIndex;
                    sampler.StartPixelSample(pPixel, sampleIndex);
                    EvaluatePixelSample(pPixel, sampleIndex, sampler, scratchBuffer);
                    scratchBuffer.Reset();
                }

                StatsReportPixelEnd(pPixel);
            }
            PBRT_DBG("Finished image tile (%d,%d)-(%d,%d)\n", tileBounds.pMin.x,
                     tileBounds.pMin.y, tileBounds.pMax.x, tileBounds.pMax.y);
            progress.Update((waveEnd - waveStart) * tileBounds.Area());
        });

        // Update start and end wave
        waveStart = waveEnd;
        waveEnd = std::min(spp, waveEnd + nextWaveSize);
        if (!referenceImage)
            nextWaveSize = std::min(2 * nextWaveSize, 64);

        // Write current image to disk
        LOG_VERBOSE("Writing image with spp = %d", waveStart);
        ImageMetadata metadata;
        metadata.renderTimeSeconds = progress.ElapsedSeconds();
        metadata.samplesPerPixel = waveStart;
        if (referenceImage) {
            ImageMetadata filmMetadata;
            Image filmImage = camera.GetFilm().GetImage(&filmMetadata, 1.f / waveStart);
            ImageChannelValues mse =
                filmImage.MSE(filmImage.AllChannelsDesc(), *referenceImage);
            fprintf(mseOutFile, "%d, %.9g\n", waveStart, mse.Average());
            metadata.MSE = mse.Average();
            fflush(mseOutFile);
        }
        camera.InitMetadata(&metadata);
        camera.GetFilm().WriteImage(metadata, 1.0f / waveStart);
    }

    if (mseOutFile)
        fclose(mseOutFile);
    progress.Done();
    LOG_VERBOSE("Rendering finished");
}